

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_get.c
# Opt level: O1

int buffer_feed(buffer *s)

{
  uint uVar1;
  _func_int_varargs *p_Var2;
  char *pcVar3;
  uint n;
  uint uVar4;
  int *piVar5;
  
  n = s->p;
  if (n == 0) {
    p_Var2 = s->op;
    uVar4 = s->fd;
    pcVar3 = s->x;
    uVar1 = s->n;
    do {
      n = (*p_Var2)((ulong)uVar4,pcVar3,(ulong)uVar1);
      if (n != 0xffffffff) break;
      piVar5 = __errno_location();
    } while (*piVar5 == error_intr);
    if (0 < (int)n) {
      s->p = n;
      uVar4 = s->n - n;
      s->n = uVar4;
      if (uVar4 != 0) {
        byte_copyr(s->x + uVar4,n,s->x);
      }
    }
  }
  return n;
}

Assistant:

int buffer_feed(buffer *s)
{
  int r;

  if (s->p) return s->p;
  r = oneread(s->op,s->fd,s->x,s->n);
  if (r <= 0) return r;
  s->p = r;
  s->n -= r;
  if (s->n > 0) byte_copyr(s->x + s->n,r,s->x);
  return r;
}